

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_gej_zinv(secp256k1_ge *r,secp256k1_gej *a,secp256k1_fe *zi)

{
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  
  secp256k1_gej_verify(a);
  secp256k1_fe_verify(zi);
  if (a->infinity == 0) {
    secp256k1_fe_sqr(&zi2,zi);
    secp256k1_fe_mul(&zi3,&zi2,zi);
    secp256k1_fe_mul(&r->x,&a->x,&zi2);
    secp256k1_fe_mul(&r->y,&a->y,&zi3);
    r->infinity = a->infinity;
    secp256k1_ge_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/group_impl.h"
          ,0x65,"test condition failed: !a->infinity");
  abort();
}

Assistant:

static void secp256k1_ge_set_gej_zinv(secp256k1_ge *r, const secp256k1_gej *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    secp256k1_gej_verify(a);
    secp256k1_fe_verify(zi);
    VERIFY_CHECK(!a->infinity);
    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;
    secp256k1_ge_verify(r);
}